

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

void __thiscall DnsStats::~DnsStats(DnsStats *this)

{
  DnsStats *this_local;
  
  BinHash<DnsNameEntry>::~BinHash(&this->nameList);
  BinHash<StatsByIP>::~BinHash(&this->statsByIp);
  BinHash<DnssecPrefixEntry>::~BinHash(&this->dnssecPrefixTable);
  BinHash<DnsPrefixEntry>::~BinHash(&this->dnsPrefixTable);
  LruHash<TldAsKey>::~LruHash(&this->tldStringUsage);
  BinHash<TldAsKey>::~BinHash(&this->registeredTld);
  BinHash<TldAddressAsKey>::~BinHash(&this->queryUsage);
  LruHash<TldAsKey>::~LruHash(&this->secondLdLeakage);
  LruHash<TldAsKey>::~LruHash(&this->tldLeakage);
  AddressUseTracker::~AddressUseTracker(&this->frequentAddresses);
  AddressFilter::~AddressFilter(&this->bannedAddresses);
  AddressFilter::~AddressFilter(&this->allowedAddresses);
  AddressFilter::~AddressFilter(&this->rootAddresses);
  BinHash<DnsHashEntry>::~BinHash(&this->hashTable);
  return;
}

Assistant:

DnsStats::~DnsStats()
{
}